

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O3

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/date_object.cpp:310:35)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_date_object_cpp:310:35)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  value *v_00;
  value *pvVar1;
  gc_heap *pgVar2;
  uint *puVar3;
  wostream *pwVar4;
  long lVar5;
  wchar_t *extraout_RDX;
  anon_class_16_1_39fd286b_for_f *this_00;
  double dVar6;
  double dVar7;
  wstring_view s;
  value v;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  object local_1c8;
  pointer local_1a8;
  undefined1 local_1a0 [376];
  
  this_00 = &this->f;
  v_00 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
         super__Vector_impl_data._M_start;
  pvVar1 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (v_00 == pvVar1) {
    lVar5 = std::chrono::_V2::system_clock::now();
    local_1d8._0_8_ = floor(((double)lVar5 / 1000000000.0) * 1000.0);
    pgVar2 = (this_00->new_date).prototype.super_gc_heap_ptr_untyped.heap_;
    gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_00);
    object::class_name((object *)local_1a0);
    gc_heap::
    allocate_and_construct<mjs::date_object,mjs::string,mjs::gc_heap_ptr<mjs::date_object>const&,double&>
              ((gc_heap *)local_1e8,(size_t)pgVar2,(string *)0x28,
               (gc_heap_ptr<mjs::date_object> *)local_1a0,(double *)this_00);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_1a0);
    local_1c8._vptr_object = (_func_int **)local_1e8._0_8_;
    local_1c8.heap_._0_4_ = local_1e8._8_4_;
    if ((slot *)local_1e8._0_8_ == (slot *)0x0) {
      __return_storage_ptr__->type_ = object;
      (__return_storage_ptr__->field_1).n_ = 0.0;
      *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 8) = local_1e8._8_4_;
    }
    else {
      gc_heap::attach((gc_heap *)local_1e8._0_8_,(gc_heap_ptr_untyped *)(local_1d8 + 0x10));
      __return_storage_ptr__->type_ = object;
      (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.
      super_gc_heap_ptr_untyped.heap_ = (gc_heap *)local_1c8._vptr_object;
      *(uint32_t *)((long)&__return_storage_ptr__->field_1 + 8) = (uint32_t)local_1c8.heap_;
      if ((slot *)local_1c8._vptr_object != (slot *)0x0) {
        gc_heap::attach((gc_heap *)local_1c8._vptr_object,
                        (gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
      }
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_1d8 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_1e8);
    return __return_storage_ptr__;
  }
  lVar5 = ((long)pvVar1 - (long)v_00 >> 3) * -0x3333333333333333;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      dVar6 = anon_unknown_37::date_helper::time_from_args(args);
      dVar7 = NAN;
      if ((ulong)ABS(dVar6) < 0x7ff0000000000000) {
        dVar7 = (double)(-(ulong)(8.64e+15 < ABS(dVar6)) & 0x7ff8000000000000 |
                        ~-(ulong)(8.64e+15 < ABS(dVar6)) & (ulong)dVar6);
      }
      __return_storage_ptr__->type_ = number;
      (__return_storage_ptr__->field_1).n_ = dVar7;
      return __return_storage_ptr__;
    }
    std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1a0);
    pwVar4 = std::operator<<((wostream *)local_1a0,"Not implemented: ");
    std::operator<<(pwVar4,"new Date(value)");
    std::__cxx11::wstringbuf::str();
    local_1e8._8_8_ = local_1c8._vptr_object;
    throw_runtime_error((wstring_view *)local_1e8,
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/date_object.cpp"
                        ,0x141);
  }
  to_primitive((value *)local_1a0,v_00,undefined);
  if (local_1a0._0_4_ == string) {
    puVar3 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_1a0 + 8));
    s._M_len = puVar3 + 1;
    s._M_str = extraout_RDX;
    local_1a8 = (pointer)anon_unknown_37::date_helper::parse((date_helper *)(ulong)*puVar3,s);
    pgVar2 = (this_00->new_date).prototype.super_gc_heap_ptr_untyped.heap_;
    gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_00);
    object::class_name((object *)(local_1d8 + 0x10));
    gc_heap::
    allocate_and_construct<mjs::date_object,mjs::string,mjs::gc_heap_ptr<mjs::date_object>const&,double&>
              ((gc_heap *)local_1d8,(size_t)pgVar2,(string *)0x28,
               (gc_heap_ptr<mjs::date_object> *)(local_1d8 + 0x10),(double *)this_00);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_1d8 + 0x10));
    local_1e8._0_8_ = local_1d8._0_8_;
    local_1e8._8_4_ = local_1d8._8_4_;
    if ((slot *)local_1d8._0_8_ != (slot *)0x0) {
      gc_heap::attach((gc_heap *)local_1d8._0_8_,(gc_heap_ptr_untyped *)local_1e8);
      __return_storage_ptr__->type_ = object;
      (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.
      super_gc_heap_ptr_untyped.heap_ = (gc_heap *)local_1e8._0_8_;
      *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 8) = local_1e8._8_4_;
      if ((slot *)local_1e8._0_8_ != (slot *)0x0) {
        gc_heap::attach((gc_heap *)local_1e8._0_8_,
                        (gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
      }
      goto LAB_00187811;
    }
  }
  else {
    local_1a8 = (pointer)to_number((value *)local_1a0);
    pgVar2 = (this_00->new_date).prototype.super_gc_heap_ptr_untyped.heap_;
    gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_00);
    object::class_name((object *)(local_1d8 + 0x10));
    gc_heap::
    allocate_and_construct<mjs::date_object,mjs::string,mjs::gc_heap_ptr<mjs::date_object>const&,double&>
              ((gc_heap *)local_1d8,(size_t)pgVar2,(string *)0x28,
               (gc_heap_ptr<mjs::date_object> *)(local_1d8 + 0x10),(double *)this_00);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_1d8 + 0x10));
    local_1e8._0_8_ = local_1d8._0_8_;
    local_1e8._8_4_ = local_1d8._8_4_;
    if ((slot *)local_1d8._0_8_ != (slot *)0x0) {
      gc_heap::attach((gc_heap *)local_1d8._0_8_,(gc_heap_ptr_untyped *)local_1e8);
      __return_storage_ptr__->type_ = object;
      (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.
      super_gc_heap_ptr_untyped.heap_ = (gc_heap *)local_1e8._0_8_;
      *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 8) = local_1e8._8_4_;
      if ((slot *)local_1e8._0_8_ != (slot *)0x0) {
        gc_heap::attach((gc_heap *)local_1e8._0_8_,
                        (gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
      }
      goto LAB_00187811;
    }
  }
  __return_storage_ptr__->type_ = object;
  (__return_storage_ptr__->field_1).n_ = 0.0;
  *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 8) = local_1d8._8_4_;
LAB_00187811:
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_1e8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_1d8);
  value::destroy((value *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }